

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

void stbtt_GetGlyphBitmapBoxSubpixel
               (stbtt_fontinfo *font,int glyph,float scale_x,float scale_y,float shift_x,
               float shift_y,int *ix0,int *iy0,int *ix1,int *iy1)

{
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  uint extraout_EDX;
  uint uVar8;
  float fVar9;
  stbtt__csctx local_68;
  
  if ((font->cff).size == 0) {
    piVar7 = iy0;
    uVar4 = stbtt__GetGlyfOffset(font,glyph);
    uVar6 = (uint)piVar7;
    if (-1 < (int)uVar4) {
      puVar1 = font->data;
      uVar3 = (int)(short)((ushort)puVar1[(ulong)uVar4 + 2] << 8) | (uint)puVar1[(ulong)uVar4 + 3];
      uVar8 = (int)(short)((ushort)puVar1[(ulong)uVar4 + 4] << 8) | (uint)puVar1[(ulong)uVar4 + 5];
      uVar6 = (int)(short)((ushort)puVar1[(ulong)uVar4 + 6] << 8) | (uint)puVar1[(ulong)uVar4 + 7];
      uVar4 = (int)(short)((ushort)puVar1[(ulong)uVar4 + 8] << 8) | (uint)puVar1[(ulong)uVar4 + 9];
      goto LAB_00212d8b;
    }
    bVar2 = true;
    uVar3 = 0;
    uVar8 = 0;
    uVar4 = extraout_EDX;
  }
  else {
    local_68.first_x = 0.0;
    local_68.first_y = 0.0;
    local_68.min_y = 0;
    local_68.max_y = 0;
    local_68.pvertices = (stbtt_vertex *)0x0;
    local_68.x = 0.0;
    local_68.y = 0.0;
    local_68.min_x = 0;
    local_68.max_x = 0;
    local_68.num_vertices = 0;
    local_68._52_4_ = 0;
    local_68.bounds = 1;
    local_68.started = 0;
    uVar3 = stbtt__run_charstring(font,glyph,&local_68);
    uVar8 = uVar3;
    uVar6 = uVar3;
    uVar4 = uVar3;
    if (uVar3 != 0) {
      uVar3 = local_68.min_x;
      uVar8 = local_68.min_y;
      uVar6 = local_68.max_x;
      uVar4 = local_68.max_y;
    }
LAB_00212d8b:
    bVar2 = false;
  }
  if (bVar2) {
    if (ix0 != (int *)0x0) {
      *ix0 = 0;
    }
    if (iy0 != (int *)0x0) {
      *iy0 = 0;
    }
    if (ix1 != (int *)0x0) {
      *ix1 = 0;
    }
    iVar5 = 0;
    if (iy1 == (int *)0x0) {
      return;
    }
    goto LAB_00212e9f;
  }
  if (ix0 != (int *)0x0) {
    fVar9 = (float)(int)uVar3 * scale_x + 0.0;
    if (0.0 <= fVar9) {
LAB_00212dfb:
      iVar5 = (int)fVar9;
    }
    else {
      if ((fVar9 == (float)(int)fVar9) && (!NAN(fVar9) && !NAN((float)(int)fVar9)))
      goto LAB_00212dfb;
      iVar5 = (int)fVar9 + -1;
    }
    *ix0 = (int)(float)iVar5;
  }
  if (iy0 != (int *)0x0) {
    fVar9 = (float)(int)-uVar4 * scale_y + 0.0;
    if (0.0 <= fVar9) {
LAB_00212e44:
      iVar5 = (int)fVar9;
    }
    else {
      if ((fVar9 == (float)(int)fVar9) && (!NAN(fVar9) && !NAN((float)(int)fVar9)))
      goto LAB_00212e44;
      iVar5 = (int)fVar9 + -1;
    }
    *iy0 = (int)(float)iVar5;
  }
  if (ix1 != (int *)0x0) {
    fVar9 = ceilf((float)(int)uVar6 * scale_x + 0.0);
    *ix1 = (int)fVar9;
  }
  if (iy1 == (int *)0x0) {
    return;
  }
  fVar9 = ceilf((float)(int)-uVar8 * scale_y + 0.0);
  iVar5 = (int)fVar9;
LAB_00212e9f:
  *iy1 = iVar5;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphBitmapBoxSubpixel(const stbtt_fontinfo *font, int glyph, float scale_x, float scale_y,float shift_x, float shift_y, int *ix0, int *iy0, int *ix1, int *iy1)
{
   int x0=0,y0=0,x1,y1; // =0 suppresses compiler warning
   if (!stbtt_GetGlyphBox(font, glyph, &x0,&y0,&x1,&y1)) {
      // e.g. space character
      if (ix0) *ix0 = 0;
      if (iy0) *iy0 = 0;
      if (ix1) *ix1 = 0;
      if (iy1) *iy1 = 0;
   } else {
      // move to integral bboxes (treating pixels as little squares, what pixels get touched)?
      if (ix0) *ix0 = STBTT_ifloor( x0 * scale_x + shift_x);
      if (iy0) *iy0 = STBTT_ifloor(-y1 * scale_y + shift_y);
      if (ix1) *ix1 = STBTT_iceil ( x1 * scale_x + shift_x);
      if (iy1) *iy1 = STBTT_iceil (-y0 * scale_y + shift_y);
   }
}